

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrMapImpl.cpp
# Opt level: O1

int __thiscall xercesc_4_0::DOMAttrMapImpl::findNamePoint(DOMAttrMapImpl *this,XMLCh *name)

{
  bool bVar1;
  int iVar2;
  long in_RAX;
  undefined4 extraout_var;
  int iVar3;
  uint uVar4;
  uint uVar5;
  undefined8 uStack_38;
  
  uStack_38._4_4_ = (int)((ulong)in_RAX >> 0x20);
  if (this->fNodes == (DOMNodeVector *)0x0) {
    uVar4 = 0;
  }
  else {
    iVar3 = (int)this->fNodes->nextFreeSlot;
    bVar1 = iVar3 < 1;
    if (iVar3 < 1) {
      uVar4 = 0;
      uVar5 = 0;
    }
    else {
      iVar3 = iVar3 + -1;
      uVar5 = 0;
      uStack_38 = in_RAX;
      do {
        uVar4 = iVar3 + uVar5 >> 1;
        iVar2 = (*this->fNodes->data[uVar4]->_vptr_DOMNode[2])();
        iVar2 = XMLString::compareString(name,(XMLCh *)CONCAT44(extraout_var,iVar2));
        if (iVar2 == 0) {
          uStack_38 = (ulong)uVar4 << 0x20;
        }
        else if (iVar2 < 0) {
          iVar3 = uVar4 - 1;
        }
        else {
          uVar5 = uVar4 + 1;
        }
        if (iVar2 == 0) goto LAB_00262af1;
        bVar1 = iVar3 < (int)uVar5;
      } while ((int)uVar5 <= iVar3);
    }
    if ((int)uVar4 < (int)uVar5) {
      uVar4 = uVar5;
    }
LAB_00262af1:
    if (!bVar1) {
      return uStack_38._4_4_;
    }
  }
  return ~uVar4;
}

Assistant:

int DOMAttrMapImpl::findNamePoint(const XMLCh *name) const
{
    // Binary search
    int i=0;
    if(fNodes!=0)
    {
        int first=0,last=(int)fNodes->size()-1;

        while(first<=last)
        {
            i=(first+last)/2;
            int test = XMLString::compareString(name, fNodes->elementAt(i)->getNodeName());
            if(test==0)
                return i; // Name found
            else if(test<0)
                last=i-1;
            else
                first=i+1;
        }
        if(first>i) i=first;
    }
    /********************
    // Linear search
    int i = 0;
    if (fNodes != 0)
    for (i = 0; i < fNodes.size(); ++i)
    {
    int test = name.compareTo(((NodeImpl *) (fNodes.elementAt(i))).getNodeName());
    if (test == 0)
    return i;
    else
    if (test < 0)
    {
    break; // Found insertpoint
    }
    }

    *******************/
    return -1 - i; // not-found has to be encoded.
}